

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_strategy.cpp
# Opt level: O2

vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
* __thiscall
license::hw_identifier::DiskStrategy::alternative_ids
          (vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
           *__return_storage_ptr__,DiskStrategy *this)

{
  pointer paVar1;
  FUNCTION_RETURN FVar2;
  LCC_API_HW_IDENTIFICATION_STRATEGY strategy;
  size_t i;
  ulong uVar3;
  long lVar4;
  int j;
  uint uVar5;
  pointer paVar6;
  array<unsigned_char,_7UL> a_disk_id;
  value_type local_80;
  vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_> data;
  vector<DiskInfo,_std::allocator<DiskInfo>_> disk_infos;
  
  data.
  super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  data.
  super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  data.
  super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  FVar2 = getDiskInfos(&disk_infos);
  if ((FVar2 == FUNC_RET_OK) &&
     ((long)disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
            super__Vector_impl_data._M_start != 0)) {
    std::vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>::
    reserve(&data,(((long)disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl
                          .super__Vector_impl_data._M_finish -
                   (long)disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
                         super__Vector_impl_data._M_start) / 0x510) * 2);
    for (uVar5 = 0;
        paVar6 = data.
                 super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        paVar1 = data.
                 super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, uVar5 != 2; uVar5 = uVar5 + 1) {
      lVar4 = 0;
      for (uVar3 = 0;
          uVar3 < (ulong)(((long)disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>.
                                _M_impl.super__Vector_impl_data._M_start) / 0x510);
          uVar3 = uVar3 + 1) {
        if (((&(disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
                super__Vector_impl_data._M_start)->preferred)[lVar4] ^ uVar5) == 1) {
          if ((disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
               super__Vector_impl_data._M_start)->label[lVar4 + -1] == '\x01') {
            a_disk_id._M_elems._4_2_ =
                 *(undefined2 *)
                  ((disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
                    super__Vector_impl_data._M_start)->disk_sn + lVar4 + 4);
            a_disk_id._M_elems[6] =
                 (disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
                  super__Vector_impl_data._M_start)->disk_sn[lVar4 + 6];
            a_disk_id._M_elems._0_4_ =
                 *(undefined4 *)
                  ((disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
                    super__Vector_impl_data._M_start)->disk_sn + lVar4);
            std::
            vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
            ::push_back(&data,&a_disk_id);
          }
          if ((&(disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
                 super__Vector_impl_data._M_start)->label_initialized)[lVar4] == true) {
            a_disk_id._M_elems[6] = '\0';
            strncpy((char *)&a_disk_id,
                    (disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
                     super__Vector_impl_data._M_start)->label + lVar4,6);
            local_80._M_elems[0] = a_disk_id._M_elems[0];
            local_80._M_elems[1] = a_disk_id._M_elems[1];
            local_80._M_elems[2] = a_disk_id._M_elems[2];
            local_80._M_elems[3] = a_disk_id._M_elems[3];
            local_80._M_elems[6] = a_disk_id._M_elems[6];
            local_80._M_elems[4] = a_disk_id._M_elems[4];
            local_80._M_elems[5] = a_disk_id._M_elems[5];
            std::
            vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
            ::push_back(&data,&local_80);
          }
        }
        lVar4 = lVar4 + 0x510;
      }
    }
    std::_Vector_base<DiskInfo,_std::allocator<DiskInfo>_>::~_Vector_base
              (&disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>);
    (__return_storage_ptr__->
    super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (paVar6 != paVar1) {
      std::
      vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
      ::reserve(__return_storage_ptr__,
                ((long)data.
                       super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)data.
                      super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 7);
      paVar1 = data.
               super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (paVar6 = data.
                    super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; paVar6 != paVar1; paVar6 = paVar6 + 1
          ) {
        HwIdentifier::HwIdentifier((HwIdentifier *)&disk_infos);
        strategy = (*(this->super_IdentificationStrategy)._vptr_IdentificationStrategy[2])(this);
        HwIdentifier::set_identification_strategy((HwIdentifier *)&disk_infos,strategy);
        HwIdentifier::set_data((HwIdentifier *)&disk_infos,paVar6);
        std::
        vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
        ::push_back(__return_storage_ptr__,(HwIdentifier *)&disk_infos);
        HwIdentifier::~HwIdentifier((HwIdentifier *)&disk_infos);
      }
    }
  }
  else {
    std::_Vector_base<DiskInfo,_std::allocator<DiskInfo>_>::~_Vector_base
              (&disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>);
    (__return_storage_ptr__->
    super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  std::
  _Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>::
  ~_Vector_base(&data.
                 super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
               );
  return __return_storage_ptr__;
}

Assistant:

std::vector<HwIdentifier> DiskStrategy::alternative_ids() const {
	vector<array<uint8_t, HW_IDENTIFIER_PROPRIETARY_DATA>> data;
	FUNCTION_RETURN result = generate_disk_pc_id(data);
	vector<HwIdentifier> identifiers;
	if (result == FUNC_RET_OK) {
		identifiers.reserve(data.size());
		for (auto &it : data) {
			HwIdentifier pc_id;
			pc_id.set_identification_strategy(identification_strategy());
			pc_id.set_data(it);
			identifiers.push_back(pc_id);
		}
	}
	return identifiers;
}